

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<long_double>::Initialize
          (TPZFMatrix<long_double> *this,initializer_list<std::initializer_list<long_double>_> *list
          )

{
  undefined1 auVar1 [16];
  size_type sVar2;
  const_iterator piVar3;
  ulong uVar4;
  void *pvVar5;
  const_iterator plVar6;
  initializer_list<std::initializer_list<long_double>_> *in_RSI;
  long in_RDI;
  uint32_t col_n;
  const_iterator col_it_end;
  const_iterator col_it;
  uint32_t row_n;
  const_iterator row_it_end;
  const_iterator row_it;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  const_iterator local_30;
  uint local_24;
  initializer_list<long_double> *local_18;
  
  sVar2 = std::initializer_list<std::initializer_list<long_double>_>::size(in_RSI);
  *(size_type *)(in_RDI + 8) = sVar2;
  local_18 = std::initializer_list<std::initializer_list<long_double>_>::begin(in_RSI);
  piVar3 = std::initializer_list<std::initializer_list<long_double>_>::end
                     ((initializer_list<std::initializer_list<long_double>_> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  sVar2 = std::initializer_list<long_double>::size(local_18);
  *(size_type *)(in_RDI + 0x10) = sVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10);
  uVar4 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *(void **)(in_RDI + 0x20) = pvVar5;
  local_24 = 0;
  for (; local_18 != piVar3; local_18 = local_18 + 1) {
    local_30 = std::initializer_list<long_double>::begin(local_18);
    plVar6 = std::initializer_list<long_double>::end
                       ((initializer_list<long_double> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    in_stack_ffffffffffffffc4 = 0;
    for (; local_30 != plVar6; local_30 = local_30 + 1) {
      *(longdouble *)
       (*(long *)(in_RDI + 0x20) +
       ((ulong)in_stack_ffffffffffffffc4 * *(long *)(in_RDI + 8) + (ulong)local_24) * 0x10) =
           *local_30;
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::Initialize(const  std::initializer_list<std::initializer_list<TVar>> &list) {
    this->fRow = list.size();

    auto row_it = list.begin();
    auto row_it_end = list.end();

#ifdef PZDEBUG
    bool col_n_found = false;
    for (auto it = row_it; it != row_it_end; it++) {
        if (!col_n_found) {
            this->fCol = it->size();
            col_n_found = true;
        } else {
            if (this->fCol != it->size())
                Error("TPZFMatrix constructor: inconsistent number of columns in initializer list");
        }
    }
#else
    this->fCol = row_it->size();
#endif

    this->fElem = new TVar[this->fRow * this->fCol];

    for (uint32_t row_n = 0; row_it != row_it_end; row_it++, row_n++) {
        auto col_it = row_it->begin();
        auto col_it_end = row_it->end();
        for (uint32_t col_n = 0; col_it != col_it_end; col_it++, col_n++) {
            this->fElem[col_n * this->fRow + row_n] = *col_it;
        }
    }
}